

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

void __thiscall
apngasm::APNGAsm::process_rect
          (APNGAsm *this,uchar *row,int rowbytes,int bpp,int stride,int h,uchar *rows)

{
  bool bVar1;
  uint uVar2;
  uInt uVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  uchar *puVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte bVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uchar *__src;
  uchar *local_88;
  
  if (0 < h) {
    uVar3 = rowbytes + 1;
    lVar8 = (long)bpp;
    lVar20 = (long)rowbytes;
    uVar9 = (ulong)(uint)bpp;
    local_88 = rows;
    iVar6 = 0;
    pbVar4 = (byte *)0x0;
    do {
      __src = this->_row_buf;
      uVar5 = 0;
      if (0 < rowbytes) {
        uVar7 = 0;
        uVar5 = 0;
        do {
          bVar10 = row[uVar7];
          uVar11 = 0x100 - bVar10;
          if (-1 < (char)bVar10) {
            uVar11 = (uint)bVar10;
          }
          __src[uVar7 + 1] = bVar10;
          uVar5 = uVar5 + uVar11;
          uVar7 = uVar7 + 1;
        } while ((uint)rowbytes != uVar7);
      }
      puVar12 = this->_sub_row;
      if (bpp < 1) {
        uVar11 = 0;
      }
      else {
        uVar7 = 0;
        uVar11 = 0;
        do {
          bVar10 = row[uVar7];
          uVar13 = 0x100 - bVar10;
          if (-1 < (char)bVar10) {
            uVar13 = (uint)bVar10;
          }
          puVar12[uVar7 + 1] = bVar10;
          uVar11 = uVar11 + uVar13;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      if (bpp < rowbytes) {
        lVar14 = 1;
        pbVar17 = row;
        do {
          bVar10 = pbVar17[lVar8] - *pbVar17;
          puVar12[lVar14 + lVar8] = bVar10;
          uVar13 = 0x100 - bVar10;
          if (-1 < (char)bVar10) {
            uVar13 = (uint)bVar10;
          }
          uVar11 = uVar13 + uVar11;
          if (uVar5 < uVar11) break;
          lVar15 = lVar8 + lVar14;
          pbVar17 = pbVar17 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar15 < lVar20);
      }
      if (uVar11 < uVar5) {
        __src = this->_sub_row;
        uVar5 = uVar11;
      }
      if (pbVar4 != (byte *)0x0) {
        uVar11 = 0;
        puVar12 = this->_up_row;
        if (rowbytes < 1) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          lVar14 = 1;
          do {
            bVar10 = row[lVar14 + -1] - pbVar4[lVar14 + -1];
            puVar12[lVar14] = bVar10;
            uVar21 = 0x100 - bVar10;
            if (-1 < (char)bVar10) {
              uVar21 = (uint)bVar10;
            }
            uVar13 = uVar21 + uVar13;
          } while ((uVar13 <= uVar5) && (bVar1 = lVar14 < lVar20, lVar14 = lVar14 + 1, bVar1));
          puVar12 = this->_up_row;
        }
        if (uVar13 < uVar5) {
          __src = puVar12;
          uVar5 = uVar13;
        }
        puVar12 = this->_avg_row;
        if (0 < bpp) {
          uVar7 = 0;
          uVar11 = 0;
          do {
            bVar10 = row[uVar7] - (pbVar4[uVar7] >> 1);
            uVar13 = 0x100 - bVar10;
            if (-1 < (char)bVar10) {
              uVar13 = (uint)bVar10;
            }
            puVar12[uVar7 + 1] = bVar10;
            uVar11 = uVar11 + uVar13;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        if (bpp < rowbytes) {
          lVar14 = 1;
          pbVar17 = pbVar4;
          pbVar18 = row;
          do {
            bVar10 = pbVar18[lVar8] - (char)((uint)*pbVar18 + (uint)pbVar17[lVar8] >> 1);
            puVar12[lVar14 + lVar8] = bVar10;
            uVar13 = 0x100 - bVar10;
            if (-1 < (char)bVar10) {
              uVar13 = (uint)bVar10;
            }
            uVar11 = uVar13 + uVar11;
            if (uVar5 < uVar11) break;
            lVar15 = lVar8 + lVar14;
            pbVar18 = pbVar18 + 1;
            pbVar17 = pbVar17 + 1;
            lVar14 = lVar14 + 1;
          } while (lVar15 < lVar20);
        }
        if (uVar11 < uVar5) {
          __src = this->_avg_row;
          uVar5 = uVar11;
        }
        puVar12 = this->_paeth_row;
        if (bpp < 1) {
          uVar11 = 0;
        }
        else {
          uVar7 = 0;
          uVar11 = 0;
          do {
            bVar10 = row[uVar7] - pbVar4[uVar7];
            uVar13 = 0x100 - bVar10;
            if (-1 < (char)bVar10) {
              uVar13 = (uint)bVar10;
            }
            puVar12[uVar7 + 1] = bVar10;
            uVar11 = uVar11 + uVar13;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        if (bpp < rowbytes) {
          lVar15 = 0;
          lVar14 = lVar8;
          do {
            lVar16 = lVar14 + 1;
            bVar10 = pbVar4[lVar15];
            uVar22 = (uint)pbVar4[lVar14] - (uint)bVar10;
            uVar21 = (uint)row[lVar15] - (uint)bVar10;
            uVar13 = -uVar22;
            if (0 < (int)uVar22) {
              uVar13 = uVar22;
            }
            uVar2 = -uVar21;
            if (0 < (int)uVar21) {
              uVar2 = uVar21;
            }
            uVar21 = uVar21 + uVar22;
            uVar22 = -uVar21;
            if (0 < (int)uVar21) {
              uVar22 = uVar21;
            }
            if ((uVar2 & 0xff) <= uVar22) {
              bVar10 = pbVar4[lVar14];
            }
            bVar19 = row[lVar15];
            if (uVar22 < (uVar13 & 0xff)) {
              bVar19 = bVar10;
            }
            if ((uVar2 & 0xff) < (uVar13 & 0xff)) {
              bVar19 = bVar10;
            }
            bVar19 = row[lVar14] - bVar19;
            puVar12[lVar16] = bVar19;
            uVar13 = 0x100 - bVar19;
            if (-1 < (char)bVar19) {
              uVar13 = (uint)bVar19;
            }
            uVar11 = uVar11 + uVar13;
          } while ((uVar11 <= uVar5) && (lVar15 = lVar15 + 1, lVar14 = lVar16, lVar16 < lVar20));
        }
        if (uVar11 < uVar5) {
          __src = this->_paeth_row;
        }
      }
      if (rows == (uchar *)0x0) {
        (this->_op_zstream1).next_in = this->_row_buf;
        (this->_op_zstream1).avail_in = uVar3;
        deflate(&this->_op_zstream1);
        (this->_op_zstream2).next_in = __src;
        (this->_op_zstream2).avail_in = uVar3;
        deflate();
      }
      else {
        memcpy(local_88,__src,(long)(int)uVar3);
        local_88 = local_88 + (int)uVar3;
      }
      iVar6 = iVar6 + 1;
      pbVar4 = row;
      row = row + stride;
    } while (iVar6 != h);
  }
  return;
}

Assistant:

void APNGAsm::process_rect(unsigned char * row, int rowbytes, int bpp, int stride, int h, unsigned char * rows)
  {
    int i, j, v;
    int a, b, c, pa, pb, pc, p;
    unsigned char * prev = NULL;
    unsigned char * dp  = rows;
    unsigned char * out;

    for (j=0; j<h; j++)
    {
      unsigned int    sum = 0;
      unsigned char * best_row = _row_buf;
      unsigned int    mins = ((unsigned int)(-1)) >> 1;

      out = _row_buf+1;
      for (i=0; i<rowbytes; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      mins = sum;

      sum = 0;
      out = _sub_row+1;
      for (i=0; i<bpp; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      for (i=bpp; i<rowbytes; i++)
      {
        v = out[i] = row[i] - row[i-bpp];
        sum += (v < 128) ? v : 256 - v;
        if (sum > mins) break;
      }
      if (sum < mins)
      {
        mins = sum;
        best_row = _sub_row;
      }

      if (prev)
      {
        sum = 0;
        out = _up_row+1;
        for (i=0; i<rowbytes; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _up_row;
        }

        sum = 0;
        out = _avg_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i]/2;
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          v = out[i] = row[i] - (prev[i] + row[i-bpp])/2;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _avg_row;
        }

        sum = 0;
        out = _paeth_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          a = row[i-bpp];
          b = prev[i];
          c = prev[i-bpp];
          p = b - c;
          pc = a - c;
          pa = abs(p);
          pb = abs(pc);
          pc = abs(p + pc);
          p = (pa <= pb && pa <=pc) ? a : (pb <= pc) ? b : c;
          v = out[i] = row[i] - p;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          best_row = _paeth_row;
        }
      }

      if (rows == NULL)
      {
        // deflate_rect_op()
        _op_zstream1.next_in = _row_buf;
        _op_zstream1.avail_in = rowbytes + 1;
        deflate(&_op_zstream1, Z_NO_FLUSH);

        _op_zstream2.next_in = best_row;
        _op_zstream2.avail_in = rowbytes + 1;
        deflate(&_op_zstream2, Z_NO_FLUSH);
      }
      else
      {
        // deflate_rect_fin()
        memcpy(dp, best_row, rowbytes+1);
        dp += rowbytes+1;
      }

      prev = row;
      row += stride;
    }
  }